

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

bool google::protobuf::compiler::js::anon_unknown_0::HasMap
               (GeneratorOptions *options,Descriptor *desc)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  
  if (0 < *(int *)((long)&(options->namespace_prefix)._M_string_length + 4)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      bVar3 = FieldDescriptor::is_map
                        ((FieldDescriptor *)
                         ((options->namespace_prefix).field_2._M_allocated_capacity + lVar4));
      if (bVar3) {
        return true;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0xa8;
    } while (lVar5 < *(int *)((long)&(options->namespace_prefix)._M_string_length + 4));
  }
  iVar1._0_1_ = options->add_require_for_enums;
  iVar1._1_1_ = options->testonly;
  iVar1._2_2_ = *(undefined2 *)&options->field_0x4a;
  if (iVar1 < 1) {
    bVar3 = false;
  }
  else {
    lVar4 = 0;
    lVar5 = 0;
    do {
      bVar3 = HasMap((GeneratorOptions *)((options->library)._M_dataplus._M_p + lVar4),desc);
      if (bVar3) {
        return bVar3;
      }
      lVar5 = lVar5 + 1;
      iVar2._0_1_ = options->add_require_for_enums;
      iVar2._1_1_ = options->testonly;
      iVar2._2_2_ = *(undefined2 *)&options->field_0x4a;
      lVar4 = lVar4 + 0xa8;
    } while (lVar5 < iVar2);
  }
  return bVar3;
}

Assistant:

bool HasMap(const GeneratorOptions& options, const Descriptor* desc) {
  for (int i = 0; i < desc->field_count(); i++) {
    if (IsMap(options, desc->field(i))) {
      return true;
    }
  }
  for (int i = 0; i < desc->nested_type_count(); i++) {
    if (HasMap(options, desc->nested_type(i))) {
      return true;
    }
  }
  return false;
}